

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_Varint64Truncation::_Run(_Test_Varint64Truncation *this)

{
  char *pcVar1;
  ulong uVar2;
  uint64_t result;
  string s;
  uint64_t large_value;
  uint64_t local_200;
  string local_1f8;
  unsigned_long local_1d8;
  Tester local_1d0;
  
  local_1d8 = 0x8000000000000064;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  PutVarint64(&local_1f8,0x8000000000000064);
  if (local_1f8._M_string_length != 1) {
    uVar2 = 0;
    do {
      local_1d0.ok_ = true;
      local_1d0.fname_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
      ;
      local_1d0.line_ = 0xa7;
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
      pcVar1 = GetVarint64Ptr(local_1f8._M_dataplus._M_p,local_1f8._M_dataplus._M_p + uVar2,
                              &local_200);
      test::Tester::Is(&local_1d0,pcVar1 == (char *)0x0,
                       "GetVarint64Ptr(s.data(), s.data() + len, &result) == nullptr");
      test::Tester::~Tester(&local_1d0);
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_1f8._M_string_length - 1);
  }
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  local_1d0.line_ = 0xaa;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  pcVar1 = GetVarint64Ptr(local_1f8._M_dataplus._M_p,
                          local_1f8._M_dataplus._M_p + local_1f8._M_string_length,&local_200);
  test::Tester::Is(&local_1d0,pcVar1 != (char *)0x0,
                   "GetVarint64Ptr(s.data(), s.data() + s.size(), &result) != nullptr");
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  local_1d0.line_ = 0xab;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  test::Tester::IsEq<unsigned_long,unsigned_long>(&local_1d0,&local_1d8,&local_200);
  test::Tester::~Tester(&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Coding, Varint64Truncation) {
  uint64_t large_value = (1ull << 63) + 100ull;
  std::string s;
  PutVarint64(&s, large_value);
  uint64_t result;
  for (size_t len = 0; len < s.size() - 1; len++) {
    ASSERT_TRUE(GetVarint64Ptr(s.data(), s.data() + len, &result) == nullptr);
  }
  ASSERT_TRUE(GetVarint64Ptr(s.data(), s.data() + s.size(), &result) !=
              nullptr);
  ASSERT_EQ(large_value, result);
}